

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::RemoveProperty(Element *this,String *name)

{
  bool bVar1;
  PropertyId id;
  ShorthandId id_00;
  bool bVar2;
  size_t __position;
  PropertyIdSet property_id_set;
  _Base_bitset<2UL> local_28;
  
  id = StyleSheetSpecification::GetPropertyId(name);
  if (id != Invalid) {
    ElementStyle::RemoveProperty(&this->meta->style,id);
    return;
  }
  id_00 = StyleSheetSpecification::GetShorthandId(name);
  if (id_00 == Invalid) {
    return;
  }
  local_28._M_w = (_WordT  [2])StyleSheetSpecification::GetShorthandUnderlyingProperties(id_00);
  if (local_28._M_w[0] == 0) {
    bVar2 = true;
    do {
      bVar1 = bVar2;
      if (!bVar1) break;
      bVar2 = false;
    } while (local_28._M_w[1] == 0);
    __position = 0x80;
    if (!bVar1) goto joined_r0x0021ad08;
  }
  __position = 1;
  do {
    bVar2 = ::std::bitset<128UL>::test((bitset<128UL> *)&local_28,__position);
    if (bVar2) goto joined_r0x0021ad08;
    __position = __position + 1;
  } while (__position != 0x80);
  __position = 0x80;
joined_r0x0021ad08:
  do {
    do {
      if (__position == 0x80) {
        return;
      }
      ElementStyle::RemoveProperty(&this->meta->style,(PropertyId)__position);
      __position = __position + 1;
    } while (0x7f < __position);
    do {
      bVar2 = ::std::bitset<128UL>::test((bitset<128UL> *)&local_28,__position);
      if (bVar2) goto joined_r0x0021ad08;
      __position = __position + 1;
    } while (__position != 0x80);
    __position = 0x80;
  } while( true );
}

Assistant:

void Element::RemoveProperty(const String& name)
{
	auto property_id = StyleSheetSpecification::GetPropertyId(name);
	if (property_id != PropertyId::Invalid)
		meta->style.RemoveProperty(property_id);
	else
	{
		auto shorthand_id = StyleSheetSpecification::GetShorthandId(name);
		if (shorthand_id != ShorthandId::Invalid)
		{
			auto property_id_set = StyleSheetSpecification::GetShorthandUnderlyingProperties(shorthand_id);
			for (auto it = property_id_set.begin(); it != property_id_set.end(); ++it)
				meta->style.RemoveProperty(*it);
		}
	}
}